

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::clearDualBounds(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,Status stat,
                 number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *upp,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *lw)

{
  double *pdVar1;
  uint uVar2;
  cpp_dec_float<100U,_int,_void> local_68;
  
  uVar2 = stat + D_ON_BOTH;
  if (uVar2 < 0xb) {
    if ((0x81U >> (uVar2 & 0x1f) & 1) == 0) {
      if ((0x104U >> (uVar2 & 0x1f) & 1) == 0) {
        if ((0x410U >> (uVar2 & 0x1f) & 1) == 0) {
          return;
        }
        pdVar1 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  (&local_68,*pdVar1,(type *)0x0);
        *(undefined8 *)((upp->m_backend).data._M_elems + 0xc) = local_68.data._M_elems._48_8_;
        *(undefined8 *)((upp->m_backend).data._M_elems + 0xe) = local_68.data._M_elems._56_8_;
        *(undefined8 *)((upp->m_backend).data._M_elems + 8) = local_68.data._M_elems._32_8_;
        *(undefined8 *)((upp->m_backend).data._M_elems + 10) = local_68.data._M_elems._40_8_;
        *(undefined8 *)((upp->m_backend).data._M_elems + 4) = local_68.data._M_elems._16_8_;
        *(undefined8 *)((upp->m_backend).data._M_elems + 6) = local_68.data._M_elems._24_8_;
        *(undefined8 *)(upp->m_backend).data._M_elems = local_68.data._M_elems._0_8_;
        *(undefined8 *)((upp->m_backend).data._M_elems + 2) = local_68.data._M_elems._8_8_;
        (upp->m_backend).exp = local_68.exp;
        (upp->m_backend).neg = local_68.neg;
        (upp->m_backend).fpclass = local_68.fpclass;
        (upp->m_backend).prec_elem = local_68.prec_elem;
        return;
      }
    }
    else {
      pdVar1 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (&local_68,*pdVar1,(type *)0x0);
      *(undefined8 *)((upp->m_backend).data._M_elems + 0xc) = local_68.data._M_elems._48_8_;
      *(undefined8 *)((upp->m_backend).data._M_elems + 0xe) = local_68.data._M_elems._56_8_;
      *(undefined8 *)((upp->m_backend).data._M_elems + 8) = local_68.data._M_elems._32_8_;
      *(undefined8 *)((upp->m_backend).data._M_elems + 10) = local_68.data._M_elems._40_8_;
      *(undefined8 *)((upp->m_backend).data._M_elems + 4) = local_68.data._M_elems._16_8_;
      *(undefined8 *)((upp->m_backend).data._M_elems + 6) = local_68.data._M_elems._24_8_;
      *(undefined8 *)(upp->m_backend).data._M_elems = local_68.data._M_elems._0_8_;
      *(undefined8 *)((upp->m_backend).data._M_elems + 2) = local_68.data._M_elems._8_8_;
      (upp->m_backend).exp = local_68.exp;
      (upp->m_backend).neg = local_68.neg;
      (upp->m_backend).fpclass = local_68.fpclass;
      (upp->m_backend).prec_elem = local_68.prec_elem;
    }
    pdVar1 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (&local_68,-*pdVar1,(type *)0x0);
    *(undefined8 *)((lw->m_backend).data._M_elems + 0xc) = local_68.data._M_elems._48_8_;
    *(undefined8 *)((lw->m_backend).data._M_elems + 0xe) = local_68.data._M_elems._56_8_;
    *(undefined8 *)((lw->m_backend).data._M_elems + 8) = local_68.data._M_elems._32_8_;
    *(undefined8 *)((lw->m_backend).data._M_elems + 10) = local_68.data._M_elems._40_8_;
    *(undefined8 *)((lw->m_backend).data._M_elems + 4) = local_68.data._M_elems._16_8_;
    *(undefined8 *)((lw->m_backend).data._M_elems + 6) = local_68.data._M_elems._24_8_;
    *(undefined8 *)(lw->m_backend).data._M_elems = local_68.data._M_elems._0_8_;
    *(undefined8 *)((lw->m_backend).data._M_elems + 2) = local_68.data._M_elems._8_8_;
    (lw->m_backend).exp = local_68.exp;
    (lw->m_backend).neg = local_68.neg;
    (lw->m_backend).fpclass = local_68.fpclass;
    (lw->m_backend).prec_elem = local_68.prec_elem;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::clearDualBounds(
   typename SPxBasisBase<R>::Desc::Status stat,
   R&                  upp,
   R&                  lw) const
{

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::P_ON_UPPER + SPxBasisBase<R>::Desc::P_ON_LOWER :
   case SPxBasisBase<R>::Desc::D_FREE :
      upp = R(infinity);
      lw  = R(-infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
   case SPxBasisBase<R>::Desc::D_ON_LOWER :
      upp = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_LOWER :
   case SPxBasisBase<R>::Desc::D_ON_UPPER :
      lw  = R(-infinity);
      break;

   default:
      break;
   }
}